

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O1

bool __thiscall QSslConfiguration::isNull(QSslConfiguration *this)

{
  QSslConfigurationPrivate *pQVar1;
  QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
  *pQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QSslDiffieHellmanParameters local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (((((pQVar1->protocol == SecureProtocols) && (pQVar1->peerVerifyMode == AutoVerifyPeer)) &&
       (pQVar1->peerVerifyDepth == 0)) &&
      ((pQVar1->allowRootCertOnDemandLoading == true && ((pQVar1->caCertificates).d.size == 0)))) &&
     (((pQVar1->ciphers).d.size == 0 && ((pQVar1->ellipticCurves).d.size == 0)))) {
    bVar4 = QSslKey::isNull(&pQVar1->ephemeralServerKey);
    if (!bVar4) goto LAB_00249fbe;
    pQVar1 = (this->d).d.ptr;
    QSslDiffieHellmanParameters::defaultParameters();
    bVar5 = QSslDiffieHellmanParameters::isEqual(&pQVar1->dhParams,&local_30);
    bVar4 = true;
    bVar3 = true;
    if ((bVar5) && (pQVar1 = (this->d).d.ptr, (pQVar1->localCertificateChain).d.size == 0)) {
      bVar5 = QSslKey::isNull(&pQVar1->privateKey);
      if (bVar5) {
        bVar5 = QSslCertificate::isNull(&((this->d).d.ptr)->peerCertificate);
        if (((((bVar5) && (pQVar1 = (this->d).d.ptr, (pQVar1->peerCertificateChain).d.size == 0)) &&
             ((pQVar2 = (pQVar1->backendConfig).d.d.ptr,
              pQVar2 == (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
                         *)0x0 || (*(size_t *)((long)&(pQVar2->m)._M_t._M_impl + 0x28) == 0)))) &&
            ((((pQVar1->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
               super_QFlagsStorage<QSsl::SslOption>.i == 0x55 &&
              ((pQVar1->sslSession).d.ptr == (char *)0x0)) &&
             (pQVar1->sslSessionTicketLifeTimeHint == -1)))) &&
           ((((pQVar1->preSharedKeyIdentityHint).d.ptr == (char *)0x0 &&
             ((pQVar1->nextAllowedProtocols).d.size == 0)) &&
            (((pQVar1->nextNegotiatedProtocol).d.ptr == (char *)0x0 &&
             (((pQVar1->nextProtocolNegotiationStatus == NextProtocolNegotiationNone &&
               (pQVar1->ocspStaplingEnabled == false)) && (pQVar1->reportFromCallback == false))))))
           )) {
          bVar4 = pQVar1->missingCertIsFatal == false;
          goto LAB_00249fc2;
        }
      }
    }
  }
  else {
LAB_00249fbe:
    bVar4 = false;
  }
  bVar3 = bVar4;
  bVar4 = false;
LAB_00249fc2:
  if (bVar3) {
    QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslConfiguration::isNull() const
{
    return (d->protocol == QSsl::SecureProtocols &&
            d->peerVerifyMode == QSslSocket::AutoVerifyPeer &&
            d->peerVerifyDepth == 0 &&
            d->allowRootCertOnDemandLoading == true &&
            d->caCertificates.size() == 0 &&
            d->ciphers.size() == 0 &&
            d->ellipticCurves.isEmpty() &&
            d->ephemeralServerKey.isNull() &&
            d->dhParams == QSslDiffieHellmanParameters::defaultParameters() &&
            d->localCertificateChain.isEmpty() &&
            d->privateKey.isNull() &&
            d->peerCertificate.isNull() &&
            d->peerCertificateChain.size() == 0 &&
            d->backendConfig.isEmpty() &&
            d->sslOptions == QSslConfigurationPrivate::defaultSslOptions &&
            d->sslSession.isNull() &&
            d->sslSessionTicketLifeTimeHint == -1 &&
            d->preSharedKeyIdentityHint.isNull() &&
            d->nextAllowedProtocols.isEmpty() &&
            d->nextNegotiatedProtocol.isNull() &&
            d->nextProtocolNegotiationStatus == QSslConfiguration::NextProtocolNegotiationNone &&
            d->ocspStaplingEnabled == false &&
            d->reportFromCallback == false &&
            d->missingCertIsFatal == false);
}